

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void corruptSchema(InitData *pData,char *zObj,char *zExtra)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  
  db = pData->db;
  if (db->mallocFailed == '\0') {
    if (*pData->pzErrMsg != (char *)0x0) {
      return;
    }
    if ((pData->mInitFlags & 1) == 0) {
      if ((db->flags & 1) == 0) {
        pcVar2 = "?";
        if (zObj != (char *)0x0) {
          pcVar2 = zObj;
        }
        pcVar2 = sqlite3MPrintf(db,"malformed database schema (%s)",pcVar2);
        if ((zExtra != (char *)0x0) && (*zExtra != '\0')) {
          pcVar2 = sqlite3MPrintf(db,"%z - %s",pcVar2,zExtra);
        }
        *pData->pzErrMsg = pcVar2;
        iVar1 = 0x1df78;
      }
      else {
        iVar1 = 0x1df71;
      }
      iVar1 = sqlite3CorruptError(iVar1);
    }
    else {
      pcVar2 = sqlite3DbStrDup(db,zExtra);
      *pData->pzErrMsg = pcVar2;
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 7;
  }
  pData->rc = iVar1;
  return;
}

Assistant:

static void corruptSchema(
  InitData *pData,     /* Initialization context */
  const char *zObj,    /* Object being parsed at the point of error */
  const char *zExtra   /* Error information */
){
  sqlite3 *db = pData->db;
  if( db->mallocFailed ){
    pData->rc = SQLITE_NOMEM_BKPT;
  }else if( pData->pzErrMsg[0]!=0 ){
    /* A error message has already been generated.  Do not overwrite it */
  }else if( pData->mInitFlags & INITFLAG_AlterTable ){
    *pData->pzErrMsg = sqlite3DbStrDup(db, zExtra);
    pData->rc = SQLITE_ERROR;
  }else if( db->flags & SQLITE_WriteSchema ){
    pData->rc = SQLITE_CORRUPT_BKPT;
  }else{
    char *z;
    if( zObj==0 ) zObj = "?";
    z = sqlite3MPrintf(db, "malformed database schema (%s)", zObj);
    if( zExtra && zExtra[0] ) z = sqlite3MPrintf(db, "%z - %s", z, zExtra);
    *pData->pzErrMsg = z;
    pData->rc = SQLITE_CORRUPT_BKPT;
  }
}